

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O3

void __thiscall
ylt::metric::thread_local_value<long>::~thread_local_value(thread_local_value<long> *this)

{
  pointer paVar1;
  atomic<std::atomic<long>_*> *t;
  pointer paVar2;
  vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  *__range3;
  
  paVar2 = (this->duplicates_).
           super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar1 = (this->duplicates_).
           super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (paVar2 != paVar1) {
    do {
      if ((paVar2->_M_b)._M_p != (__pointer_type)0x0) {
        operator_delete((paVar2->_M_b)._M_p,8);
      }
      paVar2 = paVar2 + 1;
    } while (paVar2 != paVar1);
    paVar2 = (this->duplicates_).
             super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2,(long)(this->duplicates_).
                                 super__Vector_base<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar2);
    return;
  }
  return;
}

Assistant:

~thread_local_value() {
    for (auto &t : duplicates_) {
      if (t) {
        delete t.load();
      }
    }
  }